

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementTabSet.cpp
# Opt level: O2

void __thiscall Rml::ElementTabSet::SetPanel(ElementTabSet *this,int tab_index,String *rml)

{
  ElementPtr element;
  allocator<char> local_8a;
  allocator<char> local_89;
  _Head_base<0UL,_Rml::Element_*,_false> local_88;
  __uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> local_80;
  XMLAttributes local_78;
  String local_58;
  String local_38;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"*",&local_89);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"panel",&local_8a);
  local_78.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Factory::InstanceElement((Factory *)&local_88,(Element *)0x0,&local_38,&local_58,&local_78);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_78.m_container);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  Factory::InstanceElementText(local_88._M_head_impl,rml);
  local_80._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
       (tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
       (tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_>)local_88._M_head_impl;
  local_88._M_head_impl = (Element *)0x0;
  SetPanel(this,tab_index,(ElementPtr *)&local_80);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
            ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_80);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
            ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_88);
  return;
}

Assistant:

void ElementTabSet::SetPanel(int tab_index, const String& rml)
{
	ElementPtr element = Factory::InstanceElement(nullptr, "*", "panel", XMLAttributes());
	Factory::InstanceElementText(element.get(), rml);
	SetPanel(tab_index, std::move(element));
}